

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void __thiscall
capnp::InputStreamMessageReader::~InputStreamMessageReader(InputStreamMessageReader *this)

{
  anon_class_8_1_8991fb9c local_18;
  InputStreamMessageReader *local_10;
  InputStreamMessageReader *this_local;
  
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_004c61f8;
  local_10 = this;
  if (this->readPos != (byte *)0x0) {
    local_18.this = this;
    kj::UnwindDetector::
    catchExceptionsIfUnwinding<capnp::InputStreamMessageReader::~InputStreamMessageReader()::__0>
              (&this->unwindDetector,&local_18);
  }
  kj::Array<capnp::word>::~Array(&this->ownedSpace);
  kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array(&this->moreSegments);
  MessageReader::~MessageReader(&this->super_MessageReader);
  return;
}

Assistant:

InputStreamMessageReader::~InputStreamMessageReader() noexcept(false) {
  if (readPos != nullptr) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      inputStream.skip(allEnd - readPos);
    });
  }
}